

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::TreeEnsembleClassifier::SharedCtor(TreeEnsembleClassifier *this)

{
  this->postevaluationtransform_ = 0;
  this->treeensemble_ = (TreeEnsembleParameters *)0x0;
  this->_cached_size_ = 0;
  this->_oneof_case_[0] = 0;
  return;
}

Assistant:

void TreeEnsembleClassifier::SharedCtor() {
  ::memset(&treeensemble_, 0, reinterpret_cast<char*>(&postevaluationtransform_) -
    reinterpret_cast<char*>(&treeensemble_) + sizeof(postevaluationtransform_));
  clear_has_ClassLabels();
  _cached_size_ = 0;
}